

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O2

void array_run_container_andnot
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  rle16_t *prVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  if (dst->capacity < src_1->cardinality) {
    array_container_grow(dst,src_1->cardinality,false);
  }
  iVar2 = src_2->n_runs;
  if ((long)iVar2 == 0) {
    memmove(dst->array,src_1->array,(long)src_1->cardinality * 2);
    iVar5 = src_1->cardinality;
  }
  else {
    prVar4 = src_2->runs;
    uVar9 = (uint)prVar4->value;
    uVar8 = (uint)prVar4->length + (uint)prVar4->value;
    iVar3 = src_1->cardinality;
    lVar7 = 0;
    iVar5 = 0;
    for (iVar6 = 0; iVar6 < iVar3; iVar6 = iVar6 + 1) {
      uVar1 = src_1->array[iVar6];
      if (uVar1 < uVar9) {
        lVar10 = (long)iVar5;
        iVar5 = iVar5 + 1;
        dst->array[lVar10] = uVar1;
      }
      else if (uVar8 < uVar1) {
        lVar10 = (long)(int)lVar7;
        do {
          lVar7 = lVar10 + 1;
          if (iVar2 <= lVar7) {
            uVar8 = 0x10001;
            uVar9 = 0x10001;
            lVar7 = lVar10;
            break;
          }
          uVar9 = (uint)prVar4[lVar10 + 1].value;
          uVar8 = prVar4[lVar10 + 1].length + uVar9;
          lVar10 = lVar7;
        } while (uVar8 < uVar1);
        iVar6 = iVar6 + -1;
      }
    }
  }
  dst->cardinality = iVar5;
  return;
}

Assistant:

void array_run_container_andnot(const array_container_t *src_1,
                                const run_container_t *src_2,
                                array_container_t *dst) {
    // basically following Java impl as of June 2016
    if (src_1->cardinality > dst->capacity) {
        array_container_grow(dst, src_1->cardinality, false);
    }

    if (src_2->n_runs == 0) {
        memmove(dst->array, src_1->array,
                sizeof(uint16_t) * src_1->cardinality);
        dst->cardinality = src_1->cardinality;
        return;
    }
    int32_t run_start = src_2->runs[0].value;
    int32_t run_end = run_start + src_2->runs[0].length;
    int which_run = 0;

    uint16_t val = 0;
    int dest_card = 0;
    for (int i = 0; i < src_1->cardinality; ++i) {
        val = src_1->array[i];
        if (val < run_start)
            dst->array[dest_card++] = val;
        else if (val <= run_end) {
            ;  // omitted item
        } else {
            do {
                if (which_run + 1 < src_2->n_runs) {
                    ++which_run;
                    run_start = src_2->runs[which_run].value;
                    run_end = run_start + src_2->runs[which_run].length;

                } else
                    run_start = run_end = (1 << 16) + 1;
            } while (val > run_end);
            --i;
        }
    }
    dst->cardinality = dest_card;
}